

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

double __thiscall arangodb::velocypack::Parser::scanDigitsFractional(Parser *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 0.0;
  if (this->_pos < this->_size) {
    dVar4 = 0.1;
    uVar2 = this->_pos;
    do {
      uVar1 = uVar2 + 1;
      this->_pos = uVar1;
      if (this->_start[uVar2] - 0x3a < 0xfffffff6) {
        this->_pos = uVar2;
        return dVar3;
      }
      dVar3 = dVar3 + (double)(int)(this->_start[uVar2] - 0x30) * dVar4;
      dVar4 = dVar4 / 10.0;
      uVar2 = uVar1;
    } while (this->_size != uVar1);
  }
  return dVar3;
}

Assistant:

double scanDigitsFractional() {
    double pot = 0.1;
    double x = 0.0;
    while (true) {
      int i = consume();
      if (i < 0) {
        return x;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return x;
      }
      x = x + pot * (i - '0');
      pot /= 10.0;
    }
  }